

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Transponder.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::IFF_Layer3Transponder::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_Layer3Transponder *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  StandardVariable *pSVar3;
  string local_240 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_220;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IFF_Layer3Transponder *local_18;
  IFF_Layer3Transponder *this_local;
  
  local_18 = this;
  this_local = (IFF_Layer3Transponder *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"IFF Layer 3 Transponder\n");
  LayerHeader::GetAsString_abi_cxx11_(&local_1d0,(LayerHeader *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Reporting Simulation: ");
  SimulationIdentifier::GetAsString_abi_cxx11_(&local_1f0,&(this->super_IFF_Layer3).m_RptSim);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Basic Data: ");
  Mode5TransponderBasicData::GetAsString_abi_cxx11_((KString *)&citr,&this->m_BasicData);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"Num IFF Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_IFF_Layer3).m_ui16NumIffRecs);
  std::operator<<(poVar2,"\nIFF Records:\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&(this->super_IFF_Layer3).m_vStdVarRecs);
  local_220._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&(this->super_IFF_Layer3).m_vStdVarRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_220);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_240);
    std::operator<<(local_190,local_240);
    std::__cxx11::string::~string(local_240);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_Layer3Transponder::GetAsString() const
{
    KStringStream ss;

    ss << "IFF Layer 3 Transponder\n"
        << LayerHeader::GetAsString()
        << "Reporting Simulation: " << m_RptSim.GetAsString()
        << "Basic Data: "           << m_BasicData.GetAsString() 
        << "Num IFF Records: "      << m_ui16NumIffRecs 
        << "\nIFF Records:\n";

    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }	

    return ss.str();
}